

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O1

t_int * line_tilde_perf8(t_int *w)

{
  undefined4 uVar1;
  long lVar2;
  t_int tVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  float fVar8;
  
  lVar5 = w[1];
  lVar2 = w[2];
  tVar3 = w[3];
  if (((*(uint *)(lVar5 + 0x34) >> 0x1d ^ *(uint *)(lVar5 + 0x34) >> 0x1e) & 1) == 0) {
    *(undefined4 *)(lVar5 + 0x34) = 0;
  }
  if (*(int *)(lVar5 + 0x54) != 0) {
    iVar6 = (int)(*(float *)(lVar5 + 0x4c) * *(float *)(lVar5 + 0x44));
    iVar6 = iVar6 + (uint)(iVar6 == 0);
    *(int *)(lVar5 + 0x50) = iVar6;
    fVar8 = (*(float *)(lVar5 + 0x30) - *(float *)(lVar5 + 0x34)) / (float)iVar6;
    *(float *)(lVar5 + 0x38) = fVar8;
    *(float *)(lVar5 + 0x3c) = fVar8 * *(float *)(lVar5 + 0x40);
    *(undefined4 *)(lVar5 + 0x54) = 0;
  }
  iVar6 = *(int *)(lVar5 + 0x50);
  iVar4 = (int)tVar3;
  if (iVar6 == 0) {
    uVar1 = *(undefined4 *)(lVar5 + 0x30);
    *(undefined4 *)(lVar5 + 0x34) = uVar1;
    if (iVar4 != 0) {
      lVar5 = 0;
      do {
        *(undefined4 *)(lVar2 + lVar5 * 4) = uVar1;
        *(undefined4 *)(lVar2 + 4 + lVar5 * 4) = uVar1;
        *(undefined4 *)(lVar2 + 8 + lVar5 * 4) = uVar1;
        *(undefined4 *)(lVar2 + 0xc + lVar5 * 4) = uVar1;
        *(undefined4 *)(lVar2 + 0x10 + lVar5 * 4) = uVar1;
        *(undefined4 *)(lVar2 + 0x14 + lVar5 * 4) = uVar1;
        *(undefined4 *)(lVar2 + 0x18 + lVar5 * 4) = uVar1;
        *(undefined4 *)(lVar2 + 0x1c + lVar5 * 4) = uVar1;
        lVar5 = lVar5 + 8;
      } while (iVar4 != (int)lVar5);
    }
  }
  else {
    if (iVar4 != 0) {
      fVar8 = *(float *)(lVar5 + 0x34);
      lVar7 = 0;
      do {
        *(float *)(lVar2 + lVar7 * 4) = fVar8;
        fVar8 = fVar8 + *(float *)(lVar5 + 0x3c);
        lVar7 = lVar7 + 1;
      } while (iVar4 != (int)lVar7);
    }
    *(float *)(lVar5 + 0x34) = *(float *)(lVar5 + 0x38) + *(float *)(lVar5 + 0x34);
    *(int *)(lVar5 + 0x50) = iVar6 + -1;
  }
  return w + 4;
}

Assistant:

static t_int *line_tilde_perf8(t_int *w)
{
    t_line *x = (t_line *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    t_sample f = x->x_value;

    if (PD_BIGORSMALL(f))
        x->x_value = f = 0;
    if (x->x_retarget)
    {
        int nticks = x->x_inletwas * x->x_dspticktomsec;
        if (!nticks) nticks = 1;
        x->x_ticksleft = nticks;
        x->x_biginc = (x->x_target - x->x_value)/(t_sample)nticks;
        x->x_inc = x->x_1overn * x->x_biginc;
        x->x_retarget = 0;
    }
    if (x->x_ticksleft)
    {
        t_sample f = x->x_value;
        while (n--) *out++ = f, f += x->x_inc;
        x->x_value += x->x_biginc;
        x->x_ticksleft--;
    }
    else
    {
        t_sample f = x->x_value = x->x_target;
        for (; n; n -= 8, out += 8)
        {
            out[0] = f; out[1] = f; out[2] = f; out[3] = f;
            out[4] = f; out[5] = f; out[6] = f; out[7] = f;
        }
    }
    return (w+4);
}